

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O0

NamespaceDeclaration * __thiscall
QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
          (QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *this)

{
  NamespaceDeclaration *pNVar1;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *in_RDI;
  
  reserve(in_RDI,(qsizetype)in_RDI);
  pNVar1 = rawPush(in_RDI);
  return pNVar1;
}

Assistant:

inline T &push() { reserve(1); return rawPush(); }